

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall NavierStokesBase::InitialRedistribution(NavierStokesBase *this)

{
  Geometry *lev_geom;
  Box *pBVar1;
  IntVect *pIVar2;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> fabarray_;
  EBCellFlagFab *this_00;
  BCRec *pBVar3;
  string redistribution_type;
  string redistribution_type_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  FabType FVar7;
  ostream *os_;
  EBFArrayBoxFactory *this_01;
  FabArray<amrex::EBCellFlagFab> *pFVar8;
  MultiCutFab *this_02;
  FabArray<amrex::FArrayBox> *this_03;
  int *piVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  Real time;
  undefined8 uVar13;
  undefined8 in_stack_fffffffffffff898;
  int in_stack_fffffffffffff8a0;
  int iStack_75c;
  Long LStack_758;
  Long local_750;
  uint uStack_748;
  Box result;
  Box local_6c4;
  Array4<const_double> apz;
  Array4<const_double> apy;
  Array4<const_double> apx;
  Array4<const_double> vfrac;
  Array4<const_double> ccc;
  Array4<const_double> fcz;
  Array4<const_double> fcy;
  Array4<const_amrex::EBCellFlag> local_4e0;
  MFIter mfi;
  Array4<double> local_440;
  string local_400 [32];
  string local_3e0 [32];
  FillPatchIterator S_fpi;
  MultiFab tmp;
  
  bVar4 = std::operator!=(&redistribution_type_abi_cxx11_,"StateRedist");
  if (!bVar4) {
    if (verbose != 0) {
      os_ = amrex::OutStream();
      amrex::Print::Print((Print *)&S_fpi,os_);
      pIVar2 = &S_fpi.super_MFIter.tile_size;
      std::operator<<((ostream *)pIVar2,"Doing initial redistribution... ");
      std::endl<char,std::char_traits<char>>((ostream *)pIVar2);
      amrex::Print::~Print((Print *)&S_fpi);
    }
    fabarray_.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (((this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start)->new_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    iVar5 = nghost_state(this);
    time = amrex::StateData::curTime
                     ((this->super_AmrLevel).state.
                      super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    amrex::FillPatchIterator::FillPatchIterator
              (&S_fpi,&this->super_AmrLevel,
               (MultiFab *)
               fabarray_.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,iVar5,time,0,0,NUM_STATE
              );
    iVar5 = NUM_STATE;
    iVar6 = nghost_state(this);
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    mfi.fabArray = (FabArrayBase *)0x0;
    mfi.tile_size.vect[0] = 0;
    mfi.tile_size.vect[1] = 0;
    mfi.tile_size.vect[2] = 0;
    mfi.flags = '\0';
    mfi._29_3_ = 0;
    mfi.currentIndex = 0;
    mfi.beginIndex = 0;
    amrex::MultiFab::MultiFab
              (&tmp,&(this->super_AmrLevel).grids,&(this->super_AmrLevel).dmap,iVar5,iVar6,
               (MFInfo *)&mfi,
               (this->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mfi.tile_size);
    iVar5 = NUM_STATE;
    iVar6 = nghost_state(this);
    amrex::MultiFab::Copy(&tmp,&S_fpi.m_fabs,0,0,iVar5,iVar6);
    amrex::MFIter::MFIter
              (&mfi,(FabArrayBase *)
                    fabarray_.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
    lev_geom = &(this->super_AmrLevel).geom;
    while (mfi.currentIndex < mfi.endIndex) {
      amrex::MFIter::tilebox(&local_6c4,&mfi);
      this_01 = (EBFArrayBoxFactory *)
                __dynamic_cast(((FabArrayBase *)
                               ((long)fabarray_.
                                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl
                               + 0xf0))->_vptr_FabArrayBase,
                               &amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                               &amrex::EBFArrayBoxFactory::typeinfo,0);
      if (this_01 == (EBFArrayBoxFactory *)0x0) {
        __cxa_bad_cast();
      }
      pFVar8 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab(this_01);
      piVar9 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar9 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + mfi.currentIndex;
      }
      this_00 = (pFVar8->m_fabs_v).
                super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
                _M_impl.super__Vector_impl_data._M_start[*piVar9];
      local_4e0.p = (this_00->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_4e0.ncomp = (this_00->super_BaseFab<amrex::EBCellFlag>).nvar;
      pBVar1 = &(this_00->super_BaseFab<amrex::EBCellFlag>).domain;
      local_4e0.begin.z = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      local_4e0.begin.x = (pBVar1->smallend).vect[0];
      local_4e0.begin.y = (pBVar1->smallend).vect[1];
      lVar10 = (long)(this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      lVar11 = (long)(this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
      lVar12 = (long)(this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      local_4e0.jstride = (lVar11 - (pBVar1->smallend).vect[0]) + 1;
      local_4e0.kstride =
           (lVar10 - (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
           local_4e0.jstride;
      local_4e0.nstride = (lVar12 - local_4e0.begin.z) * local_4e0.kstride;
      local_4e0.end._0_8_ = lVar11 + 1U & 0xffffffff | lVar10 << 0x20;
      local_4e0.end.z = (int)lVar12;
      FVar7 = amrex::EBCellFlagFab::getType(this_00,&local_6c4);
      if (FVar7 != covered) {
        result.bigend.vect[2] = local_6c4.bigend.vect[2];
        result.btype.itype = local_6c4.btype.itype;
        result.smallend.vect[0] = local_6c4.smallend.vect[0];
        result.smallend.vect[1] = local_6c4.smallend.vect[1];
        result.smallend.vect[0] = result.smallend.vect[0] + -4;
        result.smallend.vect[1] = result.smallend.vect[1] + -4;
        result.smallend.vect[2] = local_6c4.smallend.vect[2] + -4;
        result.bigend.vect[0] = local_6c4.bigend.vect[0] + 4;
        result.bigend.vect[1] = local_6c4.bigend.vect[1] + 4;
        result.bigend.vect[2] = result.bigend.vect[2] + 4;
        FVar7 = amrex::EBCellFlagFab::getType(this_00,&result);
        if (FVar7 != regular) {
          result.bigend.vect[1] = 0;
          result.bigend.vect[2] = 0;
          result.btype.itype = 0;
          result.smallend.vect[0] = 0;
          result.smallend.vect[1] = 0;
          result.smallend.vect[2] = 0;
          result.bigend.vect[0] = 0;
          apz.begin.z = 1;
          fcy.kstride = 0;
          fcy.nstride = 0;
          fcy.p = (double *)0x0;
          fcy.jstride = 0;
          fcy.begin.x = 1;
          fcy.begin.y = 1;
          fcy.end.x = 0;
          fcy.end.y = 0;
          fcy.end.z = 0;
          fcy.ncomp = 0;
          fcz.kstride = 0;
          fcz.nstride = 0;
          fcz.p = (double *)0x0;
          fcz.jstride = 0;
          fcz.begin.x = 1;
          fcz.begin.y = 1;
          fcz.end.x = 0;
          fcz.end.y = 0;
          fcz.end.z = 0;
          fcz.ncomp = 0;
          ccc.kstride = 0;
          ccc.nstride = 0;
          ccc.p = (double *)0x0;
          ccc.jstride = 0;
          ccc.begin.x = 1;
          ccc.begin.y = 1;
          ccc.end.x = 0;
          ccc.end.y = 0;
          ccc.end.z = 0;
          ccc.ncomp = 0;
          vfrac.kstride = 0;
          vfrac.nstride = 0;
          vfrac.p = (double *)0x0;
          vfrac.jstride = 0;
          vfrac.begin.x = 1;
          vfrac.begin.y = 1;
          vfrac.end.x = 0;
          vfrac.end.y = 0;
          vfrac.end.z = 0;
          vfrac.ncomp = 0;
          apx.kstride = 0;
          apx.nstride = 0;
          apx.p = (double *)0x0;
          apx.jstride = 0;
          apx.begin.x = 1;
          apx.begin.y = 1;
          apx.end.x = 0;
          apx.end.y = 0;
          apx.end.z = 0;
          apx.ncomp = 0;
          apy.kstride = 0;
          apy.nstride = 0;
          apy.p = (double *)0x0;
          apy.jstride = 0;
          apy.begin.x = 1;
          apy.begin.y = 1;
          apy.end.x = 0;
          apy.end.y = 0;
          apy.end.z = 0;
          apy.ncomp = 0;
          apz.kstride = 0;
          apz.nstride = 0;
          apz.p = (double *)0x0;
          apz.jstride = 0;
          apz.begin.x = 1;
          apz.begin.y = 1;
          apz.end.x = 0;
          apz.end.y = 0;
          apz.end.z = 0;
          apz.ncomp = 0;
          apy.begin.z = apz.begin.z;
          apx.begin.z = apz.begin.z;
          vfrac.begin.z = apz.begin.z;
          ccc.begin.z = apz.begin.z;
          fcz.begin.z = apz.begin.z;
          fcy.begin.z = apz.begin.z;
          amrex::EBFArrayBoxFactory::getFaceCent
                    ((Array<const_MultiCutFab_*,_3> *)&local_440,this_01);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&stack0xfffffffffffff8a0,(MultiCutFab *)local_440.p,
                     &mfi);
          result.bigend.vect[1] = (int)local_750;
          result.bigend.vect[2] = (int)((ulong)local_750 >> 0x20);
          result.btype.itype = uStack_748;
          result.smallend.vect[1] = iStack_75c;
          result.smallend.vect[2] = (int)LStack_758;
          result.bigend.vect[0] = (int)((ulong)LStack_758 >> 0x20);
          result.smallend.vect[0] = in_stack_fffffffffffff8a0;
          amrex::EBFArrayBoxFactory::getFaceCent
                    ((Array<const_MultiCutFab_*,_3> *)&local_440,this_01);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&stack0xfffffffffffff8a0,
                     (MultiCutFab *)local_440.jstride,&mfi);
          amrex::EBFArrayBoxFactory::getFaceCent
                    ((Array<const_MultiCutFab_*,_3> *)&local_440,this_01);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&stack0xfffffffffffff8a0,
                     (MultiCutFab *)local_440.kstride,&mfi);
          this_02 = amrex::EBFArrayBoxFactory::getCentroid(this_01);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&stack0xfffffffffffff8a0,this_02,&mfi);
          amrex::EBFArrayBoxFactory::getAreaFrac
                    ((Array<const_MultiCutFab_*,_3> *)&local_440,this_01);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&stack0xfffffffffffff8a0,(MultiCutFab *)local_440.p,
                     &mfi);
          amrex::EBFArrayBoxFactory::getAreaFrac
                    ((Array<const_MultiCutFab_*,_3> *)&local_440,this_01);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&stack0xfffffffffffff8a0,
                     (MultiCutFab *)local_440.jstride,&mfi);
          amrex::EBFArrayBoxFactory::getAreaFrac
                    ((Array<const_MultiCutFab_*,_3> *)&local_440,this_01);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&stack0xfffffffffffff8a0,
                     (MultiCutFab *)local_440.kstride,&mfi);
          this_03 = &amrex::EBFArrayBoxFactory::getVolFrac(this_01)->
                     super_FabArray<amrex::FArrayBox>;
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&stack0xfffffffffffff8a0,this_03,&mfi);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&stack0xfffffffffffff8a0,
                     &S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>,&mfi);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_440,&tmp.super_FabArray<amrex::FArrayBox>,&mfi);
          pBVar3 = (this->m_bcrec_velocity_d).m_data;
          uVar13 = 0x243211;
          std::__cxx11::string::string(local_3e0,(string *)&redistribution_type_abi_cxx11_);
          redistribution_type._M_string_length._0_4_ = 2;
          redistribution_type._M_dataplus._M_p = (pointer)local_3e0;
          redistribution_type._M_string_length._4_4_ = 0;
          redistribution_type.field_2._M_allocated_capacity = uVar13;
          redistribution_type.field_2._8_8_ = in_stack_fffffffffffff898;
          Redistribution::ApplyToInitialData
                    (&local_6c4,3,(Array4<double> *)&stack0xfffffffffffff8a0,&local_440,&local_4e0,
                     &apx,&apy,&apz,&vfrac,(Array4<const_double> *)&result,&fcy,&fcz,&ccc,pBVar3,
                     lev_geom,redistribution_type,in_stack_fffffffffffff8a0,0.5);
          std::__cxx11::string::~string(local_3e0);
          iVar5 = NUM_SCALARS;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&stack0xfffffffffffff8a0,
                     &S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>,&mfi,3);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_440,&tmp.super_FabArray<amrex::FArrayBox>,&mfi,3);
          pBVar3 = (this->m_bcrec_scalars_d).m_data;
          uVar13 = 0x2432fa;
          std::__cxx11::string::string(local_400,(string *)&redistribution_type_abi_cxx11_);
          redistribution_type_00._M_string_length._0_4_ = 2;
          redistribution_type_00._M_dataplus._M_p = (pointer)local_400;
          redistribution_type_00._M_string_length._4_4_ = 0;
          redistribution_type_00.field_2._M_allocated_capacity = uVar13;
          redistribution_type_00.field_2._8_8_ = in_stack_fffffffffffff898;
          Redistribution::ApplyToInitialData
                    (&local_6c4,iVar5,(Array4<double> *)&stack0xfffffffffffff8a0,&local_440,
                     &local_4e0,&apx,&apy,&apz,&vfrac,(Array4<const_double> *)&result,&fcy,&fcz,&ccc
                     ,pBVar3,lev_geom,redistribution_type_00,in_stack_fffffffffffff8a0,0.5);
          std::__cxx11::string::~string(local_400);
        }
      }
      amrex::MFIter::operator++(&mfi);
    }
    amrex::MFIter::~MFIter(&mfi);
    amrex::MultiFab::Copy
              ((MultiFab *)
               fabarray_.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&S_fpi.m_fabs,0,0,
               NUM_STATE,0);
    amrex::MultiFab::~MultiFab(&tmp);
    amrex::FillPatchIterator::~FillPatchIterator(&S_fpi);
  }
  return;
}

Assistant:

void
NavierStokesBase::InitialRedistribution ()
{
    // Next we must redistribute the initial solution if we are going to use
    // MergeRedist or StateRedist redistribution schemes
    if ( redistribution_type != "StateRedist" ) {
        return;
    }

    if (verbose) {
      amrex::Print() << "Doing initial redistribution... " << std::endl;
    }

    // Initial data are set at new time step
    MultiFab& S_new = get_new_data(State_Type);
    // We must fill internal ghost values before calling redistribution
    // We also need any physical boundary conditions imposed if we are
    //    calling state redistribution (because that calls the slope routine)
    FillPatchIterator S_fpi(*this, S_new, nghost_state(), state[State_Type].curTime(),
                            State_Type, 0, NUM_STATE);
    MultiFab& Smf=S_fpi.get_mf();

    MultiFab tmp( grids, dmap, NUM_STATE, nghost_state(), MFInfo(), Factory() );
    MultiFab::Copy(tmp, Smf, 0, 0, NUM_STATE, nghost_state());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(S_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();

        auto const& fact =  dynamic_cast<EBFArrayBoxFactory const&>(S_new.Factory());

        EBCellFlagFab const& flagfab = fact.getMultiEBCellFlagFab()[mfi];
        Array4<EBCellFlag const> const& flag = flagfab.const_array();

        // FIXME? not sure if 4 is really needed or if 3 could do
        // But this is a safe choice
        if ( (flagfab.getType(bx) != FabType::covered) &&
             (flagfab.getType(amrex::grow(bx,4)) != FabType::regular) )
        {
            Array4<Real const> AMREX_D_DECL(fcx, fcy, fcz), ccc, vfrac, AMREX_D_DECL(apx, apy, apz);

            AMREX_D_TERM(fcx = fact.getFaceCent()[0]->const_array(mfi);,
                         fcy = fact.getFaceCent()[1]->const_array(mfi);,
                         fcz = fact.getFaceCent()[2]->const_array(mfi););

            ccc   = fact.getCentroid().const_array(mfi);

            AMREX_D_TERM(apx = fact.getAreaFrac()[0]->const_array(mfi);,
                         apy = fact.getAreaFrac()[1]->const_array(mfi);,
                         apz = fact.getAreaFrac()[2]->const_array(mfi););

            vfrac = fact.getVolFrac().const_array(mfi);

            //FIXME: this is a hack due to separate bcrecs Maybe want to put in single array.
            Redistribution::ApplyToInitialData( bx, AMREX_SPACEDIM,
                                                Smf.array(mfi), tmp.array(mfi),
                                                flag, AMREX_D_DECL(apx, apy, apz), vfrac,
                                                AMREX_D_DECL(fcx, fcy, fcz),
                                                ccc, m_bcrec_velocity_d.dataPtr(),
                                                geom, redistribution_type);
            Redistribution::ApplyToInitialData( bx,NUM_SCALARS,
                                                Smf.array(mfi,Density), tmp.array(mfi,Density),
                                                flag, AMREX_D_DECL(apx, apy, apz), vfrac,
                                                AMREX_D_DECL(fcx, fcy, fcz),
                                                ccc,m_bcrec_scalars_d.dataPtr(),
                                                geom, redistribution_type);
        }
    }

    MultiFab::Copy(S_new, Smf, 0, 0, NUM_STATE, 0);
}